

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zesDeviceReadOverclockState
          (zes_device_handle_t hDevice,zes_overclock_mode_t *pOverclockMode,
          ze_bool_t *pWaiverSetting,ze_bool_t *pOverclockState,zes_pending_action_t *pPendingAction,
          ze_bool_t *pPendingReset)

{
  ze_result_t zVar1;
  
  if (DAT_0010ea70 != (code *)0x0) {
    zVar1 = (*DAT_0010ea70)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceReadOverclockState(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        zes_overclock_mode_t* pOverclockMode,           ///< [out] One of overclock mode.
        ze_bool_t* pWaiverSetting,                      ///< [out] Waiver setting: 0 = Waiver not set, 1 = waiver has been set.
        ze_bool_t* pOverclockState,                     ///< [out] Current settings 0 =manufacturing state, 1= shipped state)..
        zes_pending_action_t* pPendingAction,           ///< [out] This enum is returned when the driver attempts to set an
                                                        ///< overclock control or reset overclock settings.
        ze_bool_t* pPendingReset                        ///< [out] Pending reset 0 =manufacturing state, 1= shipped state)..
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReadOverclockState = context.zesDdiTable.Device.pfnReadOverclockState;
        if( nullptr != pfnReadOverclockState )
        {
            result = pfnReadOverclockState( hDevice, pOverclockMode, pWaiverSetting, pOverclockState, pPendingAction, pPendingReset );
        }
        else
        {
            // generic implementation
        }

        return result;
    }